

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Io_ReadFinType(char *pThis)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strcmp(pThis,"SA0");
  if (iVar1 == 0) {
    iVar1 = -99;
  }
  else {
    iVar1 = strcmp(pThis,"SA1");
    if (iVar1 == 0) {
      iVar1 = -0x62;
    }
    else {
      iVar1 = strcmp(pThis,"NEG");
      if (iVar1 == 0) {
        iVar1 = -0x61;
      }
      else {
        iVar1 = strcmp(pThis,"RDOB_AND");
        if (iVar1 == 0) {
          iVar1 = -0x60;
        }
        else {
          iVar1 = strcmp(pThis,"RDOB_NAND");
          if (iVar1 == 0) {
            iVar1 = -0x5f;
          }
          else {
            iVar1 = strcmp(pThis,"RDOB_OR");
            if (iVar1 == 0) {
              iVar1 = -0x5e;
            }
            else {
              iVar1 = strcmp(pThis,"RDOB_NOR");
              if (iVar1 == 0) {
                iVar1 = -0x5d;
              }
              else {
                iVar1 = strcmp(pThis,"RDOB_XOR");
                if (iVar1 == 0) {
                  iVar1 = -0x5c;
                }
                else {
                  iVar1 = strcmp(pThis,"RDOB_NXOR");
                  if (iVar1 == 0) {
                    iVar1 = -0x5b;
                  }
                  else {
                    iVar1 = strcmp(pThis,"RDOB_NOT");
                    if (iVar1 == 0) {
                      iVar1 = -0x5a;
                    }
                    else {
                      iVar2 = strcmp(pThis,"RDOB_BUFF");
                      iVar1 = -100;
                      if (iVar2 == 0) {
                        iVar1 = -0x59;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int Io_ReadFinType( char * pThis )
{
    if ( !strcmp(pThis, "SA0") )        return ABC_FIN_SA0;
    if ( !strcmp(pThis, "SA1") )        return ABC_FIN_SA1;
    if ( !strcmp(pThis, "NEG") )        return ABC_FIN_NEG;
    if ( !strcmp(pThis, "RDOB_AND") )   return ABC_FIN_RDOB_AND;
    if ( !strcmp(pThis, "RDOB_NAND") )  return ABC_FIN_RDOB_NAND;
    if ( !strcmp(pThis, "RDOB_OR") )    return ABC_FIN_RDOB_OR;
    if ( !strcmp(pThis, "RDOB_NOR") )   return ABC_FIN_RDOB_NOR;
    if ( !strcmp(pThis, "RDOB_XOR") )   return ABC_FIN_RDOB_XOR;
    if ( !strcmp(pThis, "RDOB_NXOR") )  return ABC_FIN_RDOB_NXOR;
    if ( !strcmp(pThis, "RDOB_NOT") )   return ABC_FIN_RDOB_NOT;
    if ( !strcmp(pThis, "RDOB_BUFF") )  return ABC_FIN_RDOB_BUFF;
    return ABC_FIN_NONE;
}